

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_base64.cpp
# Opt level: O2

wchar_t * __thiscall ON_DecodeBase64::Decode(ON_DecodeBase64 *this,wchar_t *base64str)

{
  int *piVar1;
  wchar_t *pwVar2;
  long lVar3;
  
  if (base64str != (wchar_t *)0x0) {
    lVar3 = 0;
    do {
      piVar1 = (int *)((long)base64str + lVar3);
      lVar3 = lVar3 + 4;
    } while (0xffffffa4 < *piVar1 - 0x7bU);
    pwVar2 = Decode(this,base64str,lVar3 >> 2);
    return pwVar2;
  }
  return (wchar_t *)0x0;
}

Assistant:

const wchar_t* ON_DecodeBase64::Decode(const wchar_t* base64str)
{
  const wchar_t* p;
  wchar_t w;
  if ( 0 == base64str )
    return 0;
  p = base64str;
  for(;;)
  {
    w = *p++;
    if ( w < 32 || w > 122 )
      break;
  }
  return Decode(base64str,p-base64str);
}